

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  int iVar1;
  realtype *in_RSI;
  long in_RDI;
  realtype rVar2;
  ARKodeARKStepMem step_mem;
  N_Vector *Xvecs;
  realtype *cvals;
  N_Vector yerr;
  N_Vector y;
  int nvec;
  int j;
  int retval;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector x;
  N_Vector_Ops c;
  N_Vector p_Var3;
  int local_24;
  int local_20;
  int local_4;
  
  if (*(long *)(in_RDI + 0xe8) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    x = *(N_Vector *)(in_RDI + 0xe8);
    p_Var3 = (N_Vector)x[0x11].content;
    c = x[0x11].ops;
    *in_RSI = 0.0;
    p_Var3->content = (void *)0x3ff0000000000000;
    c->nvgetvectorid = *(_func_N_Vector_ID_N_Vector **)(in_RDI + 0x110);
    local_24 = 1;
    for (local_20 = 0; local_20 < *(int *)((long)&x[3].sunctx + 4); local_20 = local_20 + 1) {
      if (*(int *)&x[1].content != 0) {
        (&p_Var3->content)[local_24] =
             (void *)(*(double *)(in_RDI + 0x168) *
                     (double)(&(((N_Vector)x[4].content)[1].ops)->nvgetvectorid)[local_20]);
        (&c->nvgetvectorid)[local_24] =
             (_func_N_Vector_ID_N_Vector *)(&(x[1].sunctx)->profiler)[local_20];
        local_24 = local_24 + 1;
      }
      if (*(int *)((long)&x[1].content + 4) != 0) {
        (&p_Var3->content)[local_24] =
             (void *)(*(double *)(in_RDI + 0x168) *
                     *(double *)((x[4].ops)->nvspace + (long)local_20 * 8));
        (&c->nvgetvectorid)[local_24] =
             (_func_N_Vector_ID_N_Vector *)(&((N_Vector)x[2].content)->content)[local_20];
        local_24 = local_24 + 1;
      }
    }
    iVar1 = N_VLinearCombination
                      ((int)((ulong)p_Var3 >> 0x20),(realtype *)c,(N_Vector *)x,
                       in_stack_ffffffffffffffa8);
    if (iVar1 == 0) {
      if (*(int *)(in_RDI + 0x1a8) == 0) {
        local_24 = 0;
        for (local_20 = 0; local_20 < *(int *)((long)&x[3].sunctx + 4); local_20 = local_20 + 1) {
          if (*(int *)&x[1].content != 0) {
            (&p_Var3->content)[local_24] =
                 (void *)(*(double *)(in_RDI + 0x168) *
                         ((double)(&(((N_Vector)x[4].content)[1].ops)->nvgetvectorid)[local_20] -
                         (double)(&(((N_Vector)x[4].content)[1].sunctx)->profiler)[local_20]));
            (&c->nvgetvectorid)[local_24] =
                 (_func_N_Vector_ID_N_Vector *)(&(x[1].sunctx)->profiler)[local_20];
            local_24 = local_24 + 1;
          }
          if (*(int *)((long)&x[1].content + 4) != 0) {
            (&p_Var3->content)[local_24] =
                 (void *)(*(double *)(in_RDI + 0x168) *
                         (*(double *)((x[4].ops)->nvspace + (long)local_20 * 8) -
                         *(double *)((x[4].ops)->nvgetarraypointer + (long)local_20 * 8)));
            (&c->nvgetvectorid)[local_24] =
                 (_func_N_Vector_ID_N_Vector *)(&((N_Vector)x[2].content)->content)[local_20];
            local_24 = local_24 + 1;
          }
        }
        iVar1 = N_VLinearCombination
                          ((int)((ulong)p_Var3 >> 0x20),(realtype *)c,(N_Vector *)x,
                           in_stack_ffffffffffffffa8);
        if (iVar1 != 0) {
          return -0x1c;
        }
        rVar2 = N_VWrmsNorm(x,in_stack_ffffffffffffffa8);
        *in_RSI = rVar2;
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_ComputeSolutions", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->yn;
  nvec = 1;
  for (j=0; j<step_mem->stages; j++) {
    if (step_mem->explicit) {      /* Explicit pieces */
      cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
    if (step_mem->implicit) {      /* Implicit pieces */
      cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      if (step_mem->explicit) {        /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit) {        /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}